

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O3

u32 __thiscall moira::Moira::bcd<(moira::Core)1,(moira::Instr)101,1>(Moira *this,u32 op1,u32 op2)

{
  u32 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = (uint)(this->reg).sr.x;
  uVar4 = (op2 & 0xf) - ((op1 & 0xf) + uVar5);
  uVar2 = (uVar4 & 0xffff) + ((op2 & 0xf0) - (op1 & 0xf0) & 0xffff);
  uVar3 = uVar2 - 6;
  uVar1 = op2 + 0x3fa;
  if ((uVar4 & 0xf0) == 0) {
    uVar3 = uVar2;
    uVar1 = op2;
  }
  bVar6 = (uVar1 - (uVar5 + op1) & 0x300) != 0;
  (this->reg).sr.x = bVar6;
  (this->reg).sr.c = bVar6;
  uVar4 = uVar3 - 0x60;
  if (((op2 - op1) - (uint)bVar6 >> 8 & 1) == 0) {
    uVar4 = uVar3;
  }
  (this->reg).sr.v = (uVar4 & 0x80) == 0 && (char)uVar2 < '\0';
  (this->reg).sr.n = SUB41((uVar4 & 0x80) >> 7,0);
  if ((char)uVar4 != '\0') {
    (this->reg).sr.z = false;
  }
  return uVar4;
}

Assistant:

u32
Moira::bcd(u32 op1, u32 op2)
{
    u64 tmp, result;

    // Extract digits
    u16 hi1 = op1 & 0xF0, lo1 = op1 & 0x0F;
    u16 hi2 = op2 & 0xF0, lo2 = op2 & 0x0F;

    switch (I) {

        case Instr::ABCD:
        case Instr::ABCD_LOOP:
        {
            // Add digits
            u16 lo = lo1 + lo2 + reg.sr.x;
            u16 hi = hi1 + hi2;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo > 9) {
                result += 0x06;
            }

            // Rectify second digit
            if ((result & 0x3F0) > 0x90) {
                result += 0x60;
                reg.sr.x = 1;
            } else {
                reg.sr.x = 0;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0) && ((result & 0x80) == 0x80);
            } else {
                reg.sr.v = 0;
            }

            break;
        }
        case Instr::SBCD:
        case Instr::SBCD_LOOP:
        {
            // Subtract digits
            u16 lo = lo2 - lo1 - reg.sr.x;
            u16 hi = hi2 - hi1;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo & 0xF0) {
                result -= 0x06;
                reg.sr.x = ((op2 - op1 - 6 - reg.sr.x) & 0x300) > 0xFF;
            } else {
                reg.sr.x = ((op2 - op1 - reg.sr.x) & 0x300) > 0xFF;
            }

            // Rectify second digit
            if (((op2 - op1 - reg.sr.x) & 0x100) > 0xFF) {
                result -= 0x60;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0x80) && ((result & 0x80) == 0);
            } else {
                reg.sr.v = 0;
            }

            break;
        }

        default:
            fatalError;
    }

    // Set other flags
    reg.sr.c = reg.sr.x;
    reg.sr.n = NBIT<S>(result);
    if (CLIP<Byte>(result)) reg.sr.z = 0;

    return (u32)result;
}